

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::push
          (stack<c4::yml::Parser::State,_16UL> *this,State *n)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  size_t sz;
  
  if ((this->m_stack <= n + 1) && (n <= this->m_stack + this->m_capacity)) {
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    (*(code *)PTR_error_impl_00243548)
              ("check failed: (const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity"
               ,0x5d,(anonymous_namespace)::s_default_callbacks);
  }
  sVar1 = this->m_capacity;
  if (this->m_size == sVar1) {
    sz = 0x10;
    if (sVar1 != 0) {
      sz = sVar1 * 2;
    }
    reserve(this,sz);
  }
  memcpy(this->m_stack + this->m_size,n,0x98);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push(T const& C4_RESTRICT n)
    {
        RYML_ASSERT((const char*)&n + sizeof(T) < (const char*)m_stack || &n > m_stack + m_capacity);
        if(m_size == m_capacity)
        {
            size_t cap = m_capacity == 0 ? N : 2 * m_capacity;
            reserve(cap);
        }
        m_stack[m_size] = n;
        ++m_size;
    }